

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::TraverseSchema::validateRedefineNameChange
          (TraverseSchema *this,DOMElement *redefineChildElem,XMLCh *redefineChildComponentName,
          XMLCh *redefineChildTypeName,int redefineNameCounter,SchemaInfo *redefiningSchemaInfo)

{
  XMLBuffer *this_00;
  short *psVar1;
  XMLCh XVar2;
  short sVar3;
  short sVar4;
  XMLStringPool *pXVar5;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar6;
  RefHashTableOf<xercesc_4_0::XercesGroupInfo,_xercesc_4_0::StringHasher> *pRVar7;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *pRVar8;
  bool bVar9;
  int iVar10;
  int key2;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined4 extraout_var;
  XMLCh *pXVar14;
  DatatypeValidator *pDVar15;
  short *psVar16;
  XMLCh *pXVar17;
  undefined4 extraout_var_01;
  ulong uVar18;
  DOMNode *node;
  undefined4 extraout_var_02;
  DOMNode *pDVar19;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  XMLCh *pXVar20;
  short *psVar21;
  long lVar22;
  char16_t *valueToAdopt;
  XMLSize_t XVar23;
  undefined2 *puVar24;
  XMLCh XVar25;
  RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher> *this_01;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *pRVar26;
  RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *pRVar27;
  RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *pRVar28;
  undefined4 extraout_var_00;
  
  iVar10 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                     (this->fStringPool,redefineChildTypeName);
  this_00 = &this->fBuffer;
  pXVar17 = this->fTargetNSURIString;
  (this->fBuffer).fIndex = 0;
  if ((pXVar17 == (XMLCh *)0x0) || (*pXVar17 == L'\0')) {
    XVar23 = 0;
  }
  else {
    XMLBuffer::append(this_00,pXVar17);
    XVar23 = this_00->fIndex;
  }
  if (XVar23 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar23 = this_00->fIndex;
  }
  (this->fBuffer).fIndex = XVar23 + 1;
  (this->fBuffer).fBuffer[XVar23] = L',';
  XMLBuffer::append(this_00,redefineChildTypeName);
  pXVar5 = this->fStringPool;
  (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
  key2 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])();
  iVar11 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])();
  pXVar17 = (XMLCh *)CONCAT44(extraout_var,iVar11);
  this->fSchemaInfo = redefiningSchemaInfo;
  if (redefineChildComponentName != L"simpleType") {
    pXVar14 = L"simpleType";
    pXVar20 = redefineChildComponentName;
    if (redefineChildComponentName == (XMLCh *)0x0) {
LAB_00333e63:
      if (*pXVar14 == L'\0') goto LAB_00333ea7;
    }
    else {
      do {
        XVar25 = *pXVar20;
        if (XVar25 == L'\0') goto LAB_00333e63;
        XVar2 = *pXVar14;
        pXVar14 = pXVar14 + 1;
        pXVar20 = pXVar20 + 1;
      } while (XVar25 == XVar2);
    }
    if (redefineChildComponentName == L"complexType") {
LAB_00333f5b:
      pRVar6 = this->fComplexTypeRegistry;
      if ((pXVar17 == (XMLCh *)0x0) || (uVar18 = (ulong)(ushort)*pXVar17, uVar18 == 0)) {
        uVar18 = 0;
      }
      else {
        XVar25 = pXVar17[1];
        if (XVar25 != L'\0') {
          pXVar14 = pXVar17 + 2;
          do {
            uVar18 = (ulong)(ushort)XVar25 + (uVar18 >> 0x18) + uVar18 * 0x26;
            XVar25 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar25 != L'\0');
        }
        uVar18 = uVar18 % pRVar6->fHashModulus;
      }
      pRVar26 = pRVar6->fBucketList[uVar18];
      if (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
        do {
          bVar9 = StringHasher::equals((StringHasher *)&pRVar6->field_0x30,pXVar17,pRVar26->fKey);
          if (bVar9) {
            return false;
          }
          pRVar26 = pRVar26->fNext;
        } while (pRVar26 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
      }
      node = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
      if (node != (DOMNode *)0x0) {
        iVar11 = (*node->_vptr_DOMNode[0x18])(node);
        psVar16 = (short *)CONCAT44(extraout_var_02,iVar11);
        if (psVar16 == &SchemaSymbols::fgELT_ANNOTATION) {
LAB_003341ed:
          node = &XUtil::getNextSiblingElement(node)->super_DOMNode;
        }
        else {
          psVar21 = &SchemaSymbols::fgELT_ANNOTATION;
          if (psVar16 == (short *)0x0) {
LAB_003341e7:
            if (*psVar21 == 0) goto LAB_003341ed;
          }
          else {
            do {
              sVar3 = *psVar16;
              if (sVar3 == 0) goto LAB_003341e7;
              psVar16 = psVar16 + 1;
              sVar4 = *psVar21;
              psVar21 = psVar21 + 1;
            } while (sVar3 == sVar4);
          }
        }
        if ((node != (DOMNode *)0x0) &&
           (pDVar19 = &XUtil::getFirstChildElement(node)->super_DOMNode,
           redefineChildElem = (DOMElement *)node, pDVar19 != (DOMNode *)0x0)) {
          iVar11 = (*pDVar19->_vptr_DOMNode[0x18])(pDVar19);
          psVar16 = (short *)CONCAT44(extraout_var_03,iVar11);
          if (psVar16 == &SchemaSymbols::fgELT_ANNOTATION) {
LAB_0033436a:
            pDVar19 = &XUtil::getNextSiblingElement(pDVar19)->super_DOMNode;
          }
          else {
            psVar21 = &SchemaSymbols::fgELT_ANNOTATION;
            if (psVar16 == (short *)0x0) {
LAB_00334364:
              if (*psVar21 == 0) goto LAB_0033436a;
            }
            else {
              do {
                sVar3 = *psVar16;
                if (sVar3 == 0) goto LAB_00334364;
                psVar16 = psVar16 + 1;
                sVar4 = *psVar21;
                psVar21 = psVar21 + 1;
              } while (sVar3 == sVar4);
            }
          }
          if (pDVar19 != (DOMNode *)0x0) {
            iVar11 = (*pDVar19->_vptr_DOMNode[0x18])(pDVar19);
            psVar16 = (short *)CONCAT44(extraout_var_05,iVar11);
            if (psVar16 != &SchemaSymbols::fgELT_RESTRICTION) {
              if (psVar16 == (short *)0x0) {
                psVar21 = &SchemaSymbols::fgELT_RESTRICTION;
LAB_00334602:
                if ((psVar16 != &SchemaSymbols::fgELT_EXTENSION) && (*psVar21 != 0))
                goto LAB_00334611;
              }
              else {
                lVar22 = 0;
                do {
                  psVar21 = (short *)((long)psVar16 + lVar22);
                  if (*psVar21 == 0) {
                    psVar21 = (short *)((long)&SchemaSymbols::fgELT_RESTRICTION + lVar22);
                    goto LAB_00334602;
                  }
                  psVar1 = (short *)((long)&SchemaSymbols::fgELT_RESTRICTION + lVar22);
                  lVar22 = lVar22 + 2;
                } while (*psVar21 == *psVar1);
                if (psVar16 != &SchemaSymbols::fgELT_EXTENSION) {
LAB_00334611:
                  psVar21 = &SchemaSymbols::fgELT_EXTENSION;
                  redefineChildElem = (DOMElement *)pDVar19;
                  if (psVar16 == (short *)0x0) {
LAB_00334637:
                    if (*psVar21 == 0) goto LAB_00334669;
                  }
                  else {
                    do {
                      sVar3 = *psVar16;
                      if (sVar3 == 0) goto LAB_00334637;
                      psVar16 = psVar16 + 1;
                      sVar4 = *psVar21;
                      psVar21 = psVar21 + 1;
                    } while (sVar3 == sVar4);
                  }
                  goto LAB_0033464a;
                }
              }
            }
LAB_00334669:
            pXVar17 = getElementAttValue(this,(DOMElement *)pDVar19,
                                         (XMLCh *)SchemaSymbols::fgATT_BASE,QName);
            iVar11 = XMLString::indexOf(pXVar17,L':');
            if (iVar11 + 1U < 2) {
              pXVar14 = L"";
            }
            else {
              (this->fBuffer).fIndex = 0;
              XMLBuffer::append(this_00,pXVar17,(long)iVar11);
              pXVar5 = this->fStringPool;
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              uVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
              iVar11 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])
                                 (pXVar5,(ulong)uVar12);
              pXVar14 = (XMLCh *)CONCAT44(extraout_var_07,iVar11);
            }
            iVar11 = XMLString::indexOf(pXVar17,L':');
            XVar23 = 0;
            if (pXVar17 != (XMLCh *)0x0) {
              do {
                psVar16 = (short *)((long)pXVar17 + XVar23);
                XVar23 = XVar23 + 2;
              } while (*psVar16 != 0);
              XVar23 = ((long)XVar23 >> 1) - 1;
            }
            if (XVar23 == (long)(iVar11 + 1)) {
              puVar24 = &XMLUni::fgZeroLenString;
            }
            else {
              if (iVar11 == -1) {
                this_00->fIndex = 0;
                pXVar20 = pXVar17;
              }
              else {
                XVar23 = XVar23 + ~(long)iVar11;
                this_00->fIndex = 0;
                pXVar20 = pXVar17 + (long)iVar11 + 1;
              }
              XMLBuffer::append(this_00,pXVar20,XVar23);
              pXVar5 = this->fStringPool;
              (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
              uVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
              iVar11 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])
                                 (pXVar5,(ulong)uVar12);
              puVar24 = (undefined2 *)CONCAT44(extraout_var_08,iVar11);
            }
            pXVar14 = resolvePrefixToURI(this,(DOMElement *)pDVar19,pXVar14);
            iVar11 = this->fTargetNSURI;
            iVar13 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                               (this->fURIStringPool,pXVar14);
            if ((iVar11 != iVar13) ||
               (iVar11 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                                   (this->fStringPool,puVar24), iVar11 != iVar10)) {
              iVar10 = 0x7b;
              goto LAB_0033464f;
            }
            getRedefineNewTypeName(this,pXVar17,redefineNameCounter,this_00);
            (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
            (*pDVar19->_vptr_DOMNode[0x2c])(pDVar19,SchemaSymbols::fgATT_BASE);
            this_01 = this->fRedefineComponents;
            puVar24 = &SchemaSymbols::fgELT_COMPLEXTYPE;
            goto LAB_003347fb;
          }
        }
      }
LAB_0033464a:
      pDVar19 = &redefineChildElem->super_DOMNode;
      iVar10 = 0x7a;
      goto LAB_0033464f;
    }
    pXVar14 = L"complexType";
    pXVar20 = redefineChildComponentName;
    if (redefineChildComponentName == (XMLCh *)0x0) {
LAB_00333f1f:
      if (*pXVar14 == L'\0') goto LAB_00333f5b;
    }
    else {
      do {
        XVar25 = *pXVar20;
        if (XVar25 == L'\0') goto LAB_00333f1f;
        XVar2 = *pXVar14;
        pXVar14 = pXVar14 + 1;
        pXVar20 = pXVar20 + 1;
      } while (XVar25 == XVar2);
    }
    pDVar19 = &redefineChildElem->super_DOMNode;
    if (redefineChildComponentName == L"group") {
LAB_00334000:
      pRVar7 = this->fGroupRegistry;
      if ((pXVar17 == (XMLCh *)0x0) || (uVar18 = (ulong)(ushort)*pXVar17, uVar18 == 0)) {
        uVar18 = 0;
      }
      else {
        XVar25 = pXVar17[1];
        if (XVar25 != L'\0') {
          pXVar14 = pXVar17 + 2;
          do {
            uVar18 = (ulong)(ushort)XVar25 + (uVar18 >> 0x18) + uVar18 * 0x26;
            XVar25 = *pXVar14;
            pXVar14 = pXVar14 + 1;
          } while (XVar25 != L'\0');
        }
        uVar18 = uVar18 % pRVar7->fHashModulus;
      }
      pRVar27 = pRVar7->fBucketList[uVar18];
      if (pRVar27 != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0) {
        do {
          bVar9 = StringHasher::equals((StringHasher *)&pRVar7->field_0x30,pXVar17,pRVar27->fKey);
          if (bVar9) {
            return false;
          }
          pRVar27 = pRVar27->fNext;
        } while (pRVar27 != (RefHashTableBucketElem<xercesc_4_0::XercesGroupInfo> *)0x0);
      }
      iVar10 = changeRedefineGroup(this,redefineChildElem,redefineChildComponentName,
                                   redefineChildTypeName,redefineNameCounter);
      if (1 < iVar10) {
        iVar10 = 0x7e;
        goto LAB_0033464f;
      }
      this_01 = this->fRedefineComponents;
      if (iVar10 == 0) {
        valueToAdopt = this->fSchemaInfo->fCurrentSchemaURL;
        puVar24 = &SchemaSymbols::fgELT_GROUP;
        goto LAB_00334801;
      }
      puVar24 = &SchemaSymbols::fgELT_GROUP;
    }
    else {
      pXVar14 = L"group";
      pXVar20 = redefineChildComponentName;
      if (redefineChildComponentName == (XMLCh *)0x0) {
LAB_00333fb4:
        if (*pXVar14 == L'\0') goto LAB_00334000;
      }
      else {
        do {
          XVar25 = *pXVar20;
          if (XVar25 == L'\0') goto LAB_00333fb4;
          XVar2 = *pXVar14;
          pXVar14 = pXVar14 + 1;
          pXVar20 = pXVar20 + 1;
        } while (XVar25 == XVar2);
      }
      if (redefineChildComponentName != L"attributeGroup") {
        pXVar17 = L"attributeGroup";
        pXVar14 = redefineChildComponentName;
        if (redefineChildComponentName != (XMLCh *)0x0) {
          do {
            XVar25 = *pXVar14;
            if (XVar25 == L'\0') goto LAB_003340cb;
            XVar2 = *pXVar17;
            pXVar17 = pXVar17 + 1;
            pXVar14 = pXVar14 + 1;
          } while (XVar25 == XVar2);
LAB_003340d1:
          reportSchemaError(this,redefineChildElem,L"http://apache.org/xml/messages/XMLErrors",0x80,
                            redefineChildComponentName,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
          return false;
        }
LAB_003340cb:
        if (*pXVar17 != L'\0') goto LAB_003340d1;
      }
      pRVar8 = this->fAttGroupRegistry;
      if ((redefineChildTypeName == (XMLCh *)0x0) ||
         (uVar18 = (ulong)(ushort)*redefineChildTypeName, uVar18 == 0)) {
        uVar18 = 0;
      }
      else {
        XVar25 = redefineChildTypeName[1];
        if (XVar25 != L'\0') {
          pXVar17 = redefineChildTypeName + 2;
          do {
            uVar18 = (ulong)(ushort)XVar25 + (uVar18 >> 0x18) + uVar18 * 0x26;
            XVar25 = *pXVar17;
            pXVar17 = pXVar17 + 1;
          } while (XVar25 != L'\0');
        }
        uVar18 = uVar18 % pRVar8->fHashModulus;
      }
      pRVar28 = pRVar8->fBucketList[uVar18];
      if (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0) {
        do {
          bVar9 = StringHasher::equals
                            ((StringHasher *)&pRVar8->field_0x30,redefineChildTypeName,pRVar28->fKey
                            );
          if (bVar9) {
            return false;
          }
          pRVar28 = pRVar28->fNext;
        } while (pRVar28 != (RefHashTableBucketElem<xercesc_4_0::XercesAttGroupInfo> *)0x0);
      }
      iVar10 = changeRedefineGroup(this,redefineChildElem,redefineChildComponentName,
                                   redefineChildTypeName,redefineNameCounter);
      if (1 < iVar10) {
        iVar10 = 0x7f;
        goto LAB_0033464f;
      }
      this_01 = this->fRedefineComponents;
      if (iVar10 == 0) {
        valueToAdopt = this->fSchemaInfo->fCurrentSchemaURL;
        puVar24 = &SchemaSymbols::fgELT_ATTRIBUTEGROUP;
        goto LAB_00334801;
      }
      puVar24 = &SchemaSymbols::fgELT_ATTRIBUTEGROUP;
    }
LAB_003347fb:
    valueToAdopt = (char16_t *)0x0;
LAB_00334801:
    RefHash2KeysTableOf<char16_t,_xercesc_4_0::StringHasher>::put(this_01,puVar24,key2,valueToAdopt)
    ;
    return true;
  }
LAB_00333ea7:
  pDVar15 = DatatypeValidatorFactory::getDatatypeValidator(this->fDatatypeRegistry,pXVar17);
  if (pDVar15 != (DatatypeValidator *)0x0) {
    return false;
  }
  pDVar19 = &XUtil::getFirstChildElement(&redefineChildElem->super_DOMNode)->super_DOMNode;
  if (pDVar19 != (DOMNode *)0x0) {
    iVar11 = (*pDVar19->_vptr_DOMNode[0x18])(pDVar19);
    psVar16 = (short *)CONCAT44(extraout_var_00,iVar11);
    if (psVar16 == &SchemaSymbols::fgELT_ANNOTATION) {
LAB_0033405f:
      pDVar19 = &XUtil::getNextSiblingElement(pDVar19)->super_DOMNode;
    }
    else {
      psVar21 = &SchemaSymbols::fgELT_ANNOTATION;
      if (psVar16 == (short *)0x0) {
LAB_00334059:
        if (*psVar21 == 0) goto LAB_0033405f;
      }
      else {
        do {
          sVar3 = *psVar16;
          if (sVar3 == 0) goto LAB_00334059;
          psVar16 = psVar16 + 1;
          sVar4 = *psVar21;
          psVar21 = psVar21 + 1;
        } while (sVar3 == sVar4);
      }
    }
    if (pDVar19 != (DOMNode *)0x0) {
      iVar11 = (*pDVar19->_vptr_DOMNode[0x18])(pDVar19);
      psVar16 = (short *)CONCAT44(extraout_var_01,iVar11);
      if (psVar16 == &SchemaSymbols::fgELT_RESTRICTION) {
LAB_0033427c:
        pXVar17 = getElementAttValue(this,(DOMElement *)pDVar19,(XMLCh *)SchemaSymbols::fgATT_BASE,
                                     QName);
        iVar11 = XMLString::indexOf(pXVar17,L':');
        if (iVar11 + 1U < 2) {
          pXVar14 = L"";
        }
        else {
          (this->fBuffer).fIndex = 0;
          XMLBuffer::append(this_00,pXVar17,(long)iVar11);
          pXVar5 = this->fStringPool;
          (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
          uVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
          iVar11 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar12);
          pXVar14 = (XMLCh *)CONCAT44(extraout_var_04,iVar11);
        }
        iVar11 = XMLString::indexOf(pXVar17,L':');
        XVar23 = 0;
        if (pXVar17 != (XMLCh *)0x0) {
          do {
            psVar16 = (short *)((long)pXVar17 + XVar23);
            XVar23 = XVar23 + 2;
          } while (*psVar16 != 0);
          XVar23 = ((long)XVar23 >> 1) - 1;
        }
        if (XVar23 == (long)(iVar11 + 1)) {
          puVar24 = &XMLUni::fgZeroLenString;
        }
        else {
          if (iVar11 == -1) {
            this_00->fIndex = 0;
            pXVar20 = pXVar17;
          }
          else {
            XVar23 = XVar23 + ~(long)iVar11;
            this_00->fIndex = 0;
            pXVar20 = pXVar17 + (long)iVar11 + 1;
          }
          XMLBuffer::append(this_00,pXVar20,XVar23);
          pXVar5 = this->fStringPool;
          (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
          uVar12 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[5])(pXVar5);
          iVar11 = (*(pXVar5->super_XSerializable)._vptr_XSerializable[10])(pXVar5,(ulong)uVar12);
          puVar24 = (undefined2 *)CONCAT44(extraout_var_06,iVar11);
        }
        pXVar14 = resolvePrefixToURI(this,(DOMElement *)pDVar19,pXVar14);
        iVar11 = this->fTargetNSURI;
        iVar13 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                           (this->fURIStringPool,pXVar14);
        if ((iVar11 != iVar13) ||
           (iVar11 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                               (this->fStringPool,puVar24), iVar11 != iVar10)) {
          iVar10 = 0x79;
          goto LAB_0033464f;
        }
        getRedefineNewTypeName(this,pXVar17,redefineNameCounter,this_00);
        (this->fBuffer).fBuffer[(this->fBuffer).fIndex] = L'\0';
        (*pDVar19->_vptr_DOMNode[0x2c])(pDVar19,SchemaSymbols::fgATT_BASE);
        this_01 = this->fRedefineComponents;
        puVar24 = &SchemaSymbols::fgELT_SIMPLETYPE;
        goto LAB_003347fb;
      }
      psVar21 = &SchemaSymbols::fgELT_RESTRICTION;
      redefineChildElem = (DOMElement *)pDVar19;
      if (psVar16 == (short *)0x0) {
LAB_0033425f:
        if (*psVar21 == 0) goto LAB_0033427c;
      }
      else {
        do {
          sVar3 = *psVar16;
          if (sVar3 == 0) goto LAB_0033425f;
          psVar16 = psVar16 + 1;
          sVar4 = *psVar21;
          psVar21 = psVar21 + 1;
        } while (sVar3 == sVar4);
      }
    }
  }
  pDVar19 = &redefineChildElem->super_DOMNode;
  iVar10 = 0x78;
LAB_0033464f:
  reportSchemaError(this,(DOMElement *)pDVar19,L"http://apache.org/xml/messages/XMLErrors",iVar10);
  return false;
}

Assistant:

bool TraverseSchema::validateRedefineNameChange(const DOMElement* const redefineChildElem,
                                                const XMLCh* const redefineChildComponentName,
                                                const XMLCh* const redefineChildTypeName,
                                                const int redefineNameCounter,
                                                SchemaInfo* const redefiningSchemaInfo) {

    const XMLCh* baseTypeName = 0;
    unsigned int typeNameId = fStringPool->addOrFind(redefineChildTypeName);

    fBuffer.set(fTargetNSURIString);
    fBuffer.append(chComma);
    fBuffer.append(redefineChildTypeName);

    int   fullTypeNameId = fStringPool->addOrFind(fBuffer.getRawBuffer());
    const XMLCh* typeNameStr = fStringPool->getValueForId(fullTypeNameId);

    restoreSchemaInfo(redefiningSchemaInfo);

    if (XMLString::equals(redefineChildComponentName,SchemaSymbols::fgELT_SIMPLETYPE)) {

        if (fDatatypeRegistry->getDatatypeValidator(typeNameStr)) {
            return false;
        }

        DOMElement* grandKid = XUtil::getFirstChildElement(redefineChildElem);

        if (grandKid && XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
            grandKid = XUtil::getNextSiblingElement(grandKid);
        }

        if (grandKid == 0) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleType);
            return false;
        }
        else if(!XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_RESTRICTION)) {

            reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleType);
            return false;
        }

        baseTypeName = getElementAttValue(grandKid, SchemaSymbols::fgATT_BASE, DatatypeValidator::QName);
        const XMLCh* prefix = getPrefix(baseTypeName);
        const XMLCh* localPart = getLocalPart(baseTypeName);
        const XMLCh* uriStr = resolvePrefixToURI(grandKid, prefix);

        if (fTargetNSURI != (int) fURIStringPool->addOrFind(uriStr)
            || fStringPool->addOrFind(localPart) != typeNameId) {
            reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidSimpleTypeBase);
            return false;
        }

        // now we have to do the renaming...
        getRedefineNewTypeName(baseTypeName, redefineNameCounter, fBuffer);
        grandKid->setAttribute(SchemaSymbols::fgATT_BASE, fBuffer.getRawBuffer());
        fRedefineComponents->put((void*) SchemaSymbols::fgELT_SIMPLETYPE,
                                 fullTypeNameId, 0);
    }
    else if (XMLString::equals(redefineChildComponentName,SchemaSymbols::fgELT_COMPLEXTYPE)) {

        if (fComplexTypeRegistry->containsKey(typeNameStr)) {
            return false;
        }

        DOMElement* grandKid = XUtil::getFirstChildElement(redefineChildElem);

        if (grandKid && XMLString::equals(grandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
            grandKid = XUtil::getNextSiblingElement(grandKid);
        }

        if (grandKid == 0) {
            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
            return false;
        } else {

            // have to go one more level down; let another pass worry whether complexType is valid.
            DOMElement* greatGrandKid = XUtil::getFirstChildElement(grandKid);

            if (greatGrandKid != 0 &&
                XMLString::equals(greatGrandKid->getLocalName(), SchemaSymbols::fgELT_ANNOTATION)) {
                greatGrandKid = XUtil::getNextSiblingElement(greatGrandKid);
            }

            if (greatGrandKid == 0) {

                reportSchemaError(grandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
                return false;
            } else {

                const XMLCh* greatGrandKidName = greatGrandKid->getLocalName();

                if (!XMLString::equals(greatGrandKidName, SchemaSymbols::fgELT_RESTRICTION)
                    && !XMLString::equals(greatGrandKidName, SchemaSymbols::fgELT_EXTENSION)) {

                    reportSchemaError(greatGrandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexType);
                    return false;
                }

                baseTypeName = getElementAttValue(greatGrandKid, SchemaSymbols::fgATT_BASE, DatatypeValidator::QName);
                const XMLCh* prefix = getPrefix(baseTypeName);
                const XMLCh* localPart = getLocalPart(baseTypeName);
                const XMLCh* uriStr = resolvePrefixToURI(greatGrandKid, prefix);

                if (fTargetNSURI != (int) fURIStringPool->addOrFind(uriStr)
                    || fStringPool->addOrFind(localPart) != typeNameId) {
                    reportSchemaError(greatGrandKid, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_InvalidComplexTypeBase);
                    return false;
                }

                // now we have to do the renaming...
                getRedefineNewTypeName(baseTypeName, redefineNameCounter, fBuffer);
                greatGrandKid->setAttribute(SchemaSymbols::fgATT_BASE, fBuffer.getRawBuffer());
                fRedefineComponents->put((void*) SchemaSymbols::fgELT_COMPLEXTYPE,
                                         fullTypeNameId, 0);
            }
        }
    }
    else if (XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_GROUP)) {

        if (fGroupRegistry->containsKey(typeNameStr)) {
            return false;
        }

        int groupRefCount = changeRedefineGroup(redefineChildElem, redefineChildComponentName,
                                                redefineChildTypeName, redefineNameCounter);

        if (groupRefCount > 1) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_GroupRefCount);
            return false;
        }
        else if (groupRefCount == 0) {
            // put a dummy value, default is null.
            // when processing groups, we will check that table, if a value
            // is found, we need to do a particle derivation check.
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_GROUP,
                                     fullTypeNameId, fSchemaInfo->getCurrentSchemaURL());
        }
        else {
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_GROUP, fullTypeNameId, 0);
        }
    }
    else if (XMLString::equals(redefineChildComponentName, SchemaSymbols::fgELT_ATTRIBUTEGROUP)) {

        if (fAttGroupRegistry->containsKey(redefineChildTypeName)) {
            return false;
        }

        int attGroupRefCount = changeRedefineGroup(redefineChildElem, redefineChildComponentName,
                                                   redefineChildTypeName, redefineNameCounter);

        if (attGroupRefCount > 1) {

            reportSchemaError(redefineChildElem, XMLUni::fgXMLErrDomain, XMLErrs::Redefine_AttGroupRefCount);
            return false;
        }
        else if (attGroupRefCount == 0) {
            // put a dummy value, default is null.
            // when processing attributeGroups, we will check that table, if
            // a value is found, we need to check for attribute derivation ok
            // (by restriction)
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_ATTRIBUTEGROUP,
                                     fullTypeNameId, fSchemaInfo->getCurrentSchemaURL());
        }
        else {
            fRedefineComponents->put((void*) SchemaSymbols::fgELT_ATTRIBUTEGROUP, fullTypeNameId, 0);
        }
    }
    else {
        reportSchemaError
        (
            redefineChildElem
            , XMLUni::fgXMLErrDomain
            , XMLErrs::Redefine_InvalidChild
            , redefineChildComponentName
        );
        return false;
    }

    return true;
}